

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRewrite.c
# Opt level: O3

void Abc_ManShowCutCone_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vDivs)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Abc_Ntk_t *pAVar4;
  Abc_Ntk_t *pAVar5;
  void **ppvVar6;
  int in_EDX;
  int Fill;
  
  pAVar4 = pNode->pNtk;
  iVar1 = pNode->Id;
  Vec_IntFillExtra(&pAVar4->vTravIds,iVar1 + 1,in_EDX);
  if (((long)iVar1 < 0) || ((pAVar4->vTravIds).nSize <= iVar1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar5 = pNode->pNtk;
  iVar2 = pAVar5->nTravIds;
  if ((pAVar4->vTravIds).pArray[iVar1] != iVar2) {
    iVar1 = pNode->Id;
    Vec_IntFillExtra(&pAVar5->vTravIds,iVar1 + 1,Fill);
    if (((long)iVar1 < 0) || ((pAVar5->vTravIds).nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (pAVar5->vTravIds).pArray[iVar1] = iVar2;
    Abc_ManShowCutCone_rec((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray],vDivs);
    Abc_ManShowCutCone_rec
              ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]],vDivs);
    uVar3 = vDivs->nSize;
    if (uVar3 == vDivs->nCap) {
      if ((int)uVar3 < 0x10) {
        if (vDivs->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc(0x80);
        }
        else {
          ppvVar6 = (void **)realloc(vDivs->pArray,0x80);
        }
        vDivs->pArray = ppvVar6;
        vDivs->nCap = 0x10;
      }
      else {
        if (vDivs->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc((ulong)uVar3 << 4);
        }
        else {
          ppvVar6 = (void **)realloc(vDivs->pArray,(ulong)uVar3 << 4);
        }
        vDivs->pArray = ppvVar6;
        vDivs->nCap = uVar3 * 2;
      }
    }
    else {
      ppvVar6 = vDivs->pArray;
    }
    iVar1 = vDivs->nSize;
    vDivs->nSize = iVar1 + 1;
    ppvVar6[iVar1] = pNode;
  }
  return;
}

Assistant:

void Abc_ManShowCutCone_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vDivs )
{
    if ( Abc_NodeIsTravIdCurrent(pNode) )
        return;
    Abc_NodeSetTravIdCurrent(pNode);
    Abc_ManShowCutCone_rec( Abc_ObjFanin0(pNode), vDivs );
    Abc_ManShowCutCone_rec( Abc_ObjFanin1(pNode), vDivs );
    Vec_PtrPush( vDivs, pNode );
}